

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O0

bool __thiscall QWidgetResizeHandler::eventFilter(QWidgetResizeHandler *this,QObject *o,QEvent *ee)

{
  byte bVar1;
  bool bVar2;
  Type TVar3;
  MouseButton MVar4;
  Int IVar5;
  QWidget *pQVar6;
  QPoint QVar7;
  QPoint this_00;
  ulong uVar8;
  byte bVar9;
  QMargins *in_RDX;
  int __fd;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMouseEvent *e_1;
  QMouseEvent *e;
  QWidget *w;
  QPoint cursorPoint;
  QRect widgetRect;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  undefined1 uVar10;
  QWidget *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  QPoint *pos;
  QFlagsStorage<Qt::MouseButton> lhs;
  QWidget *this_01;
  bool local_a5;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_9c;
  QRect local_98;
  QPoint local_88;
  QPoint local_80;
  QKeyEvent *local_78;
  QKeyEvent *e_00;
  QWidgetResizeHandler *in_stack_ffffffffffffff98;
  QMouseEvent *in_stack_ffffffffffffffb8;
  QWidgetResizeHandler *in_stack_ffffffffffffffc0;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  e_00 = local_78;
  bVar2 = isEnabled((QWidgetResizeHandler *)in_RDI);
  if ((bVar2) &&
     ((((TVar3 = QEvent::type((QEvent *)in_RDX), TVar3 == MouseButtonPress ||
        (TVar3 = QEvent::type((QEvent *)in_RDX), TVar3 == MouseButtonRelease)) ||
       (TVar3 = QEvent::type((QEvent *)in_RDX), TVar3 == MouseMove)) ||
      ((TVar3 = QEvent::type((QEvent *)in_RDX), TVar3 == KeyPress ||
       (TVar3 = QEvent::type((QEvent *)in_RDX), TVar3 == ShortcutOverride)))))) {
    this_01 = *(QWidget **)&in_RDI->super_QPaintDevice;
    pQVar6 = QApplication::activePopupWidget();
    if (pQVar6 == (QWidget *)0x0) {
      TVar3 = QEvent::type((QEvent *)in_RDX);
      pQVar6 = (QWidget *)(ulong)(TVar3 - MouseButtonPress);
      switch(pQVar6) {
      case (QWidget *)0x0:
        bVar2 = QWidget::isMaximized(this_01);
        if (!bVar2) {
          local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QWidget::rect(in_RDI);
          QMargins::QMargins((QMargins *)pQVar6,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                             (int)in_stack_ffffffffffffff08,
                             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                             (int)in_stack_ffffffffffffff00);
          local_18 = (undefined1  [16])QRect::marginsAdded((QRect *)this_01,in_RDX);
          pos = *(QPoint **)&in_RDI->super_QPaintDevice;
          QSinglePointEvent::globalPosition((QSinglePointEvent *)0x668fd9);
          QVar7 = QPointF::toPoint((QPointF *)pQVar6);
          this_00 = QWidget::mapFromGlobal(pQVar6,pos);
          uVar8 = QRect::contains((QPoint *)local_18,SUB81(&stack0xffffffffffffffc0,0));
          if ((uVar8 & 1) == 0) {
            local_a5 = false;
            goto LAB_00669304;
          }
          MVar4 = QSinglePointEvent::button((QSinglePointEvent *)in_RDX);
          if (MVar4 == LeftButton) {
            in_RDI[1].field_0x18 = in_RDI[1].field_0x18 & 0xfe;
            activate((QWidgetResizeHandler *)0x669066);
            mouseMoveEvent((QWidgetResizeHandler *)this_00,(QMouseEvent *)QVar7);
            in_RDI[1].field_0x18 = in_RDI[1].field_0x18 & 0xfe | 1;
            QSinglePointEvent::globalPosition((QSinglePointEvent *)0x669099);
            QPointF::toPoint((QPointF *)pQVar6);
            QVar7 = QWidget::mapFromGlobal(pQVar6,pos);
            in_RDI->data = (QWidgetData *)QVar7;
            local_98 = QWidget::rect(in_RDI);
            local_88 = QRect::bottomRight((QRect *)CONCAT17(in_stack_fffffffffffffeff,
                                                            CONCAT16(in_stack_fffffffffffffefe,
                                                                     CONCAT24(
                                                  in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8))));
            local_80 = ::operator-((QPoint *)pQVar6,pos);
            *(QPoint *)(in_RDI + 1) = local_80;
            if (*(int *)&in_RDI[1].field_0x8 != 9) {
              local_a5 = true;
              goto LAB_00669304;
            }
          }
        }
        break;
      case (QWidget *)0x1:
        bVar2 = QWidget::isMaximized(this_01);
        if ((!bVar2) &&
           (MVar4 = QSinglePointEvent::button((QSinglePointEvent *)in_RDX), MVar4 == LeftButton)) {
          in_RDI[1].field_0x18 = in_RDI[1].field_0x18 & 0xfd;
          in_RDI[1].field_0x18 = in_RDI[1].field_0x18 & 0xfe;
          QWidget::releaseMouse((QWidget *)0x6691a6);
          QWidget::releaseKeyboard(in_stack_ffffffffffffff00);
          if (*(int *)&in_RDI[1].field_0x8 != 9) {
            local_a5 = true;
            goto LAB_00669304;
          }
        }
        break;
      default:
        break;
      case (QWidget *)0x3:
        bVar2 = QWidget::isMaximized(this_01);
        if (!bVar2) {
          uVar10 = false;
          if ((in_RDI[1].field_0x18 & 1) != 0) {
            QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_ffffffffffffff00);
            local_9c.super_QFlagsStorage<Qt::MouseButton>.i =
                 (QFlagsStorage<Qt::MouseButton>)
                 QFlags<Qt::MouseButton>::operator&
                           ((QFlags<Qt::MouseButton> *)in_stack_ffffffffffffff00,
                            CONCAT13(uVar10,CONCAT12(in_stack_fffffffffffffefe,
                                                     in_stack_fffffffffffffefc)));
            IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_9c);
            uVar10 = IVar5 != 0;
          }
          in_RDI[1].field_0x18 = in_RDI[1].field_0x18 & 0xfe | uVar10;
          mouseMoveEvent(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          if (*(int *)&in_RDI[1].field_0x8 != 9) {
            local_a5 = true;
            goto LAB_00669304;
          }
        }
        break;
      case (QWidget *)0x4:
        keyPressEvent(in_stack_ffffffffffffff98,e_00);
        break;
      case (QWidget *)0x31:
        QGuiApplication::mouseButtons();
        lhs.i = (Int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        QFlags<Qt::MouseButton>::operator&
                  ((QFlags<Qt::MouseButton> *)in_stack_ffffffffffffff00,
                   CONCAT13(in_stack_fffffffffffffeff,
                            CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
        __fd = 0;
        bVar2 = ::operator!=((QFlags<Qt::MouseButton>)lhs.i,(MouseButton)in_stack_ffffffffffffff00);
        bVar1 = in_RDI[1].field_0x18 & 1 & bVar2;
        bVar9 = in_RDI[1].field_0x18 & 0xfe | bVar1;
        in_RDI[1].field_0x18 = bVar9;
        if ((in_RDI[1].field_0x18 & 1) != 0) {
          QEvent::accept((QEvent *)in_RDX,__fd,(sockaddr *)(ulong)bVar1,(socklen_t *)(ulong)bVar9);
          local_a5 = true;
          goto LAB_00669304;
        }
      }
      local_a5 = false;
    }
    else {
      if (((in_RDI[1].field_0x18 & 1) != 0) &&
         (TVar3 = QEvent::type((QEvent *)in_RDX), TVar3 == MouseButtonRelease)) {
        in_RDI[1].field_0x18 = in_RDI[1].field_0x18 & 0xfe;
      }
      local_a5 = false;
    }
  }
  else {
    local_a5 = false;
  }
LAB_00669304:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_a5;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetResizeHandler::eventFilter(QObject *o, QEvent *ee)
{
    if (!isEnabled()
        || (ee->type() != QEvent::MouseButtonPress
            && ee->type() != QEvent::MouseButtonRelease
            && ee->type() != QEvent::MouseMove
            && ee->type() != QEvent::KeyPress
            && ee->type() != QEvent::ShortcutOverride)
        )
        return false;

    Q_ASSERT(o == widget);
    QWidget *w = widget;
    if (QApplication::activePopupWidget()) {
        if (buttonDown && ee->type() == QEvent::MouseButtonRelease)
            buttonDown = false;
        return false;
    }

    switch (ee->type()) {
    case QEvent::MouseButtonPress: {
        QMouseEvent *e = static_cast<QMouseEvent *>(ee);
        if (w->isMaximized())
            break;
        const QRect widgetRect = widget->rect().marginsAdded(QMargins(range, range, range, range));
        const QPoint cursorPoint = widget->mapFromGlobal(e->globalPosition().toPoint());
        if (!widgetRect.contains(cursorPoint))
            return false;
        if (e->button() == Qt::LeftButton) {
            buttonDown = false;
            emit activate();
            mouseMoveEvent(e);
            buttonDown = true;
            moveOffset = widget->mapFromGlobal(e->globalPosition().toPoint());
            invertedMoveOffset = widget->rect().bottomRight() - moveOffset;
            if (mode != Center)
                return true;
        }
    } break;
    case QEvent::MouseButtonRelease:
        if (w->isMaximized())
            break;
        if (static_cast<QMouseEvent *>(ee)->button() == Qt::LeftButton) {
            active = false;
            buttonDown = false;
            widget->releaseMouse();
            widget->releaseKeyboard();
            if (mode != Center)
                return true;
        }
        break;
    case QEvent::MouseMove: {
        if (w->isMaximized())
            break;
        QMouseEvent *e = static_cast<QMouseEvent *>(ee);
        buttonDown = buttonDown && (e->buttons() & Qt::LeftButton); // safety, state machine broken!
        mouseMoveEvent(e);
        if (mode != Center)
            return true;
    } break;
    case QEvent::KeyPress:
        keyPressEvent(static_cast<QKeyEvent *>(ee));
        break;
    case QEvent::ShortcutOverride:
        buttonDown &= ((QGuiApplication::mouseButtons() & Qt::LeftButton) != Qt::NoButton);
        if (buttonDown) {
            ee->accept();
            return true;
        }
        break;
    default:
        break;
    }

    return false;
}